

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

bool __thiscall SocketInternals::ExtractInterfaceInfo(SocketInternals *this,MsgHeaderType *hdr)

{
  int iVar1;
  cmsghdr *__cmsg;
  char *pcVar2;
  ostream *poVar3;
  int *piVar4;
  bool bVar5;
  ifreq ifr;
  char ifName [256];
  char local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  char local_118 [264];
  
  this->InterfaceIndex = -1;
  if (hdr->msg_controllen < 0x10) {
    __cmsg = (cmsghdr *)0x0;
  }
  else {
    __cmsg = (cmsghdr *)hdr->msg_control;
  }
  for (; __cmsg != (cmsghdr *)0x0; __cmsg = __cmsg_nxthdr((msghdr *)hdr,__cmsg)) {
    if ((__cmsg->cmsg_level == 0) && (__cmsg->cmsg_type == 8)) {
      this->InterfaceIndex = (int)__cmsg[1].cmsg_len;
    }
  }
  pcVar2 = if_indextoname(this->InterfaceIndex,local_118);
  if (pcVar2 == (char *)0x0) {
    poVar3 = std::operator<<(this->outStr,"Recv: failed if_indextoname: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar5 = false;
  }
  else {
    std::__cxx11::string::assign((char *)&this->InterfaceName);
    local_138 = 0;
    uStack_130 = 0;
    local_148[0] = '\0';
    local_148[1] = '\0';
    local_148[2] = '\0';
    local_148[3] = '\0';
    local_148[4] = '\0';
    local_148[5] = '\0';
    local_148[6] = '\0';
    local_148[7] = '\0';
    local_148[8] = '\0';
    local_148[9] = '\0';
    local_148[10] = '\0';
    local_148[0xb] = '\0';
    local_148[0xc] = '\0';
    local_148[0xd] = '\0';
    local_148[0xe] = '\0';
    local_148[0xf] = '\0';
    local_128 = 0;
    strcpy(local_148,(this->InterfaceName)._M_dataplus._M_p);
    iVar1 = ioctl(this->SocketFD,0x8921,local_148);
    bVar5 = iVar1 == 0;
    if (bVar5) {
      this->InterfaceMTU = (int)local_138;
    }
  }
  return bVar5;
}

Assistant:

bool SocketInternals::ExtractInterfaceInfo(MsgHeaderType *hdr)
{
    InterfaceIndex = -1;
    // iterate through all the control headers
    for (CMsgHdrType * cmsg = CMSG_FIRSTHDR(hdr);
         cmsg != NULL;
         cmsg = CMSG_NXTHDR(hdr, cmsg)) {
        // ignore the control headers that don't match what we want
        if (cmsg->cmsg_level != IPPROTO_IP ||
            cmsg->cmsg_type != IP_PKTINFO) {
            continue;
        }
        // struct in_pktinfo * pi = CMSG_DATA(cmsg)->ipi;
        // at this point, peeraddr is the source sockaddr
        // pi->ipi_spec_dst is the destination in_addr
        InterfaceIndex = ((struct in_pktinfo*)CMSG_DATA(cmsg))->ipi_ifindex;
    }

    // should check if index != -1

#ifdef _MSC_VER
    // Windows supports if_indextoname, but the name returned does not appear to be
    // meaningful. Also, Windows does not appear to support ioctl (or WSAIoctl) to
    // query the MTU value. Thus, we instead use GetAdaptersAddresses, which gives us
    // both the InterfaceName and InterfaceMTU for the specified InterfaceIndex.
    //
    // We first call GetAdaptersAddresses with a null buffer to query the required buffer size.
    PIP_ADAPTER_ADDRESSES addrList = 0;
    ULONG bufSize = 0;
    ULONG retval;
    retval = GetAdaptersAddresses(AF_INET, GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER,
                                  NULL, addrList, &bufSize);
    if (retval != ERROR_BUFFER_OVERFLOW) {
        outStr << "Recv: GetAdaptersAddresses failed to return buffer size" << std::endl;
        return false;
    }
    // Now, bufSize indicates the correct buffer size. Allocate memory and then call
    // GetAdaptersAddresses again to get the information.
    char *buffer = new char[bufSize];
    addrList = reinterpret_cast<PIP_ADAPTER_ADDRESSES>(buffer);
    retval = GetAdaptersAddresses(AF_INET, GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER,
                                  NULL, addrList, &bufSize);
    if (retval == NO_ERROR) {
        for (PIP_ADAPTER_ADDRESSES addr = addrList;  addr != 0; addr = addr->Next) {
            if (addr->IfIndex == InterfaceIndex) {
                char fname[256];  // Should be large enough
                if (WideCharToMultiByte(CP_ACP, 0, addr->FriendlyName, -1, fname, sizeof(fname), NULL, NULL) > 0) {
                        InterfaceName = fname;
                        InterfaceMTU = addr->Mtu;
                        break;
                }
            }
        }
    }
    delete [] buffer;
#else
    // get interface name and MTU
    char ifName[256];
    if (if_indextoname(InterfaceIndex, ifName) == NULL) {
        outStr << "Recv: failed if_indextoname: " << strerror(errno) << std::endl;
        return false;
    }
    InterfaceName = ifName;

    struct ifreq ifr;
    memset(&ifr, 0, sizeof(ifr));
    strcpy(ifr.ifr_name, InterfaceName.c_str());
    if (!ioctl(SocketFD, SIOCGIFMTU, &ifr)) {
        InterfaceMTU = ifr.ifr_mtu;
        return true;
    }
#endif
    return false;
}